

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  char *pcVar1;
  int iVar2;
  UnitTest *this;
  ostream *poVar3;
  size_t sVar4;
  stat info;
  char local_ad;
  int local_ac;
  stat local_a8;
  
  local_ac = argc;
  testing::InitGoogleTest(&local_ac,argv);
  pcVar1 = DAT_001545e8;
  if (testing::FLAGS_gtest_list_tests == '\0') {
    if (local_ac != 2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
      pcVar1 = *argv;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1555f8);
      }
      else {
        sVar4 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," <test images path>\n",0x14);
      return -1;
    }
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace(0x1545e0,0,pcVar1,(ulong)__s);
    iVar2 = stat((anonymous_namespace)::testImagesPath_abi_cxx11_,&local_a8);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Cannot access ",0xe)
      ;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(anonymous_namespace)::testImagesPath_abi_cxx11_,
                          (long)DAT_001545e8);
      local_ad = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_ad,1);
      return -2;
    }
    if ((local_a8.st_mode._1_1_ & 0x40) == 0) {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(anonymous_namespace)::testImagesPath_abi_cxx11_,
                          (long)DAT_001545e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"is not a valid directory\n",0x19);
      return -3;
    }
  }
  this = testing::UnitTest::GetInstance();
  iVar2 = testing::UnitTest::Run(this);
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
    ::testing::InitGoogleTest(&argc, argv);

    if (!::testing::FLAGS_gtest_list_tests)
    {
        if (argc != 2)
        {
            std::cerr << "Usage: " << argv[0] << " <test images path>\n";
            return -1;
        }

        testImagesPath = argv[1];

        struct stat info;
        if (stat(testImagesPath.data(), &info) != 0)
        {
            std::cerr << "Cannot access " << testImagesPath << '\n';
            return -2;
        }
        else if (!(info.st_mode & S_IFDIR))
        {
            std::cerr << testImagesPath << "is not a valid directory\n";
            return -3;
        }
    }

    return RUN_ALL_TESTS();
}